

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O3

void av1_fill_mv_costs(nmv_context *nmvc,int integer_mv,int usehp,MvCosts *mv_costs)

{
  int **mvcost;
  int **mvcost_00;
  
  if (mv_costs == (MvCosts *)0x0) {
    return;
  }
  mvcost = mv_costs->nmv_cost;
  mv_costs->nmv_cost[0] = mv_costs->nmv_cost_alloc[0] + 0x3fff;
  mv_costs->nmv_cost[1] = mv_costs->nmv_cost_alloc[1] + 0x3fff;
  mv_costs->nmv_cost_hp[0] = mv_costs->nmv_cost_hp_alloc[0] + 0x3fff;
  mv_costs->nmv_cost_hp[1] = mv_costs->nmv_cost_hp_alloc[1] + 0x3fff;
  if (integer_mv != 0) {
    mv_costs->mv_cost_stack = mvcost;
    av1_build_nmv_cost_table(mv_costs->nmv_joint_cost,mvcost,nmvc,-1);
    return;
  }
  mvcost_00 = mv_costs->nmv_cost_hp;
  if (usehp == 0) {
    mvcost_00 = mvcost;
  }
  mv_costs->mv_cost_stack = mvcost_00;
  av1_build_nmv_cost_table(mv_costs->nmv_joint_cost,mvcost_00,nmvc,(MvSubpelPrecision)usehp);
  return;
}

Assistant:

void av1_fill_mv_costs(const nmv_context *nmvc, int integer_mv, int usehp,
                       MvCosts *mv_costs) {
  // Avoid accessing 'mv_costs' when it is not allocated.
  if (mv_costs == NULL) return;

  mv_costs->nmv_cost[0] = &mv_costs->nmv_cost_alloc[0][MV_MAX];
  mv_costs->nmv_cost[1] = &mv_costs->nmv_cost_alloc[1][MV_MAX];
  mv_costs->nmv_cost_hp[0] = &mv_costs->nmv_cost_hp_alloc[0][MV_MAX];
  mv_costs->nmv_cost_hp[1] = &mv_costs->nmv_cost_hp_alloc[1][MV_MAX];
  if (integer_mv) {
    mv_costs->mv_cost_stack = (int **)&mv_costs->nmv_cost;
    av1_build_nmv_cost_table(mv_costs->nmv_joint_cost, mv_costs->mv_cost_stack,
                             nmvc, MV_SUBPEL_NONE);
  } else {
    mv_costs->mv_cost_stack =
        usehp ? mv_costs->nmv_cost_hp : mv_costs->nmv_cost;
    av1_build_nmv_cost_table(mv_costs->nmv_joint_cost, mv_costs->mv_cost_stack,
                             nmvc, usehp);
  }
}